

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DeleteAll(Fts3Table *p,int bContent)

{
  long lVar1;
  int in_ESI;
  Fts3Table *in_RDI;
  long in_FS_OFFSET;
  int rc;
  sqlite3_value **in_stack_ffffffffffffffd8;
  uint in_stack_fffffffffffffff0;
  int iVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  sqlite3Fts3PendingTermsClear((Fts3Table *)(ulong)in_stack_fffffffffffffff0);
  if (in_ESI != 0) {
    fts3SqlExec((int *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_RDI,in_ESI,
                in_stack_ffffffffffffffd8);
  }
  fts3SqlExec((int *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_RDI,in_ESI,
              in_stack_ffffffffffffffd8);
  fts3SqlExec((int *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_RDI,in_ESI,
              in_stack_ffffffffffffffd8);
  if (in_RDI->bHasDocsize != '\0') {
    fts3SqlExec((int *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_RDI,in_ESI,
                in_stack_ffffffffffffffd8);
  }
  if (in_RDI->bHasStat != '\0') {
    fts3SqlExec((int *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_RDI,in_ESI,
                in_stack_ffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3DeleteAll(Fts3Table *p, int bContent){
  int rc = SQLITE_OK;             /* Return code */

  /* Discard the contents of the pending-terms hash table. */
  sqlite3Fts3PendingTermsClear(p);

  /* Delete everything from the shadow tables. Except, leave %_content as
  ** is if bContent is false.  */
  assert( p->zContentTbl==0 || bContent==0 );
  if( bContent ) fts3SqlExec(&rc, p, SQL_DELETE_ALL_CONTENT, 0);
  fts3SqlExec(&rc, p, SQL_DELETE_ALL_SEGMENTS, 0);
  fts3SqlExec(&rc, p, SQL_DELETE_ALL_SEGDIR, 0);
  if( p->bHasDocsize ){
    fts3SqlExec(&rc, p, SQL_DELETE_ALL_DOCSIZE, 0);
  }
  if( p->bHasStat ){
    fts3SqlExec(&rc, p, SQL_DELETE_ALL_STAT, 0);
  }
  return rc;
}